

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

CallRef * __thiscall
wasm::Builder::makeCallRef<ArenaVector<wasm::Expression*>>
          (Builder *this,Expression *target,ArenaVector<wasm::Expression_*> *args,Type type,
          bool isReturn)

{
  CallRef *this_00;
  CallRef *call;
  bool isReturn_local;
  ArenaVector<wasm::Expression_*> *args_local;
  Expression *target_local;
  Builder *this_local;
  Type type_local;
  
  this_00 = MixedArena::alloc<wasm::CallRef>(&this->wasm->allocator);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)56>).super_Expression.type.id = type.id;
  this_00->target = target;
  ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
  set<ArenaVector<wasm::Expression*>>
            ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)&this_00->operands
             ,args);
  this_00->isReturn = isReturn;
  CallRef::finalize(this_00);
  return this_00;
}

Assistant:

CallRef* makeCallRef(Expression* target,
                       const T& args,
                       Type type,
                       bool isReturn = false) {
    auto* call = wasm.allocator.alloc<CallRef>();
    call->type = type;
    call->target = target;
    call->operands.set(args);
    call->isReturn = isReturn;
    call->finalize();
    return call;
  }